

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

int CVmBifTADS::re_match
              (re_pattern_buffer *__buffer,char *__string,int __length,int __start,
              re_registers *__regs)

{
  vm_val_t *pvVar1;
  vm_globalvar_t *pvVar2;
  CRegexSearcherSimple *pCVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  vm_val_t *pvVar5;
  undefined4 uVar6;
  vm_val_t *pvVar7;
  int iVar8;
  uint uVar9;
  ushort *puVar10;
  ushort *entirestr;
  ushort *puVar11;
  int iVar12;
  int32_t iVar13;
  ushort *puVar14;
  uint argc;
  long val;
  byte *searchlen;
  char *pcVar15;
  ushort *puVar16;
  
  argc = (uint)__buffer;
  CVmBif::check_argc_range(argc,2,3);
  pvVar7 = sp_;
  pvVar1 = sp_ + -3;
  pvVar5 = sp_ + -2;
  uVar6 = *(undefined4 *)&sp_[-2].field_0x4;
  aVar4 = sp_[-2].val;
  sp_ = sp_ + 1;
  pvVar7->typ = pvVar5->typ;
  *(undefined4 *)&pvVar7->field_0x4 = uVar6;
  pvVar7->val = aVar4;
  pvVar5 = sp_;
  uVar6 = *(undefined4 *)&pvVar7[-1].field_0x4;
  aVar4 = pvVar7[-1].val;
  sp_ = sp_ + 1;
  pvVar5->typ = pvVar7[-1].typ;
  *(undefined4 *)&pvVar5->field_0x4 = uVar6;
  pvVar5->val = aVar4;
  iVar13 = 1;
  if (2 < argc) {
    if (pvVar1->typ != VM_INT) {
      err_throw(0x900);
    }
    iVar13 = pvVar7[-3].val.intval;
  }
  pvVar2 = G_bif_tads_globals_X->last_rex_str;
  uVar6 = *(undefined4 *)&pvVar7[-2].field_0x4;
  aVar4 = pvVar7[-2].val;
  (pvVar2->val).typ = pvVar7[-2].typ;
  *(undefined4 *)&(pvVar2->val).field_0x4 = uVar6;
  (pvVar2->val).val = aVar4;
  pCVar3 = G_bif_tads_globals_X->rex_searcher;
  *(undefined4 *)&pCVar3->field_0x64 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x68 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x6c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x70 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x54 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x58 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x5c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x60 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x44 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x48 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x4c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x50 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x34 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x38 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x3c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x40 = 0xffffffff;
  *(undefined4 *)&(pCVar3->super_CRegexSearcher).field_0x24 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x28 = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x2c = 0xffffffff;
  *(undefined4 *)&pCVar3->field_0x30 = 0xffffffff;
  (pCVar3->match_).start_ofs = -1;
  (pCVar3->match_).end_ofs = -1;
  if ((sp_[-1].typ == VM_OBJ) &&
     (iVar8 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                     [sp_[-1].val.obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff),
                         CVmObjPattern::metaclass_reg_), iVar8 != 0)) {
    pcVar15 = (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]->ptr_).obj_ +
              (sp_[-1].val.obj & 0xfff) * 0x18;
    puVar11 = (ushort *)0x0;
    sp_ = sp_ + -1;
  }
  else {
    pcVar15 = (char *)0x0;
    puVar11 = (ushort *)CVmBif::pop_str_val();
  }
  puVar10 = (ushort *)CVmBif::pop_str_val();
  searchlen = (byte *)(ulong)*puVar10;
  entirestr = puVar10 + 1;
  iVar8 = -1;
  if (iVar13 < 0) {
    if (searchlen == (byte *)0x0) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      puVar14 = entirestr;
      do {
        puVar14 = (ushort *)
                  ((long)puVar14 +
                  (ulong)((((byte)*puVar14 >> 5 & 1) != 0) + 1 &
                         (uint)(byte)((byte)*puVar14 >> 7) * 3) + 1);
        iVar8 = iVar8 + 1;
      } while (puVar14 < (ushort *)((long)entirestr + (long)searchlen));
    }
  }
  iVar12 = iVar8 + iVar13;
  puVar14 = entirestr;
  puVar16 = entirestr;
  if (*puVar10 != 0 && (iVar12 != 0 && SCARRY4(iVar8,iVar13) == iVar12 < 0)) {
    do {
      puVar14 = (ushort *)
                ((long)puVar16 +
                (ulong)((((byte)*puVar16 >> 5 & 1) != 0) + 1 & (uint)(byte)((byte)*puVar16 >> 7) * 3
                       ) + 1);
      searchlen = (byte *)((long)puVar16 + ((long)searchlen - (long)puVar14));
      if (iVar12 < 2) break;
      iVar12 = iVar12 + -1;
      puVar16 = puVar14;
    } while (searchlen != (byte *)0x0);
  }
  if (pcVar15 == (char *)0x0) {
    uVar9 = CRegexSearcherSimple::compile_and_match
                      (G_bif_tads_globals_X->rex_searcher,(char *)(puVar11 + 1),(ulong)*puVar11,
                       (char *)entirestr,(char *)puVar14,(size_t)searchlen);
  }
  else {
    uVar9 = CRegexSearcherSimple::match_pattern
                      (G_bif_tads_globals_X->rex_searcher,
                       (re_compiled_pattern *)**(undefined8 **)(pcVar15 + 8),(char *)entirestr,
                       (char *)puVar14,(size_t)searchlen);
  }
  if ((int)uVar9 < 0) {
    CVmBif::retval_nil();
  }
  else {
    val = 0;
    if (uVar9 != 0) {
      puVar11 = (ushort *)((ulong)uVar9 + (long)puVar14);
      do {
        puVar14 = (ushort *)
                  ((long)puVar14 +
                  (ulong)((((byte)*puVar14 >> 5 & 1) != 0) + 1 &
                         (uint)(byte)((byte)*puVar14 >> 7) * 3) + 1);
        val = val + 1;
      } while (puVar14 < puVar11);
    }
    CVmBif::retval_int(val);
  }
  sp_ = sp_ + -(long)(int)argc;
  return argc * 0x10;
}

Assistant:

void CVmBifTADS::re_match(VMG_ uint argc)
{
    const char *str;
    utf8_ptr p;
    size_t len;
    int match_len;
    vm_val_t *v1, *v2, *v3;
    int start_idx;
    CVmObjPattern *pat_obj = 0;
    const char *pat_str = 0;
    
    /* check arguments */
    check_argc_range(vmg_ argc, 2, 3);

    /* 
     *   make copies of the arguments, so we can pop the values without
     *   actually removing them from the stack - leave the originals on the
     *   stack for gc protection 
     */
    v1 = G_stk->get(0);
    v2 = G_stk->get(1);
    v3 = (argc >= 3 ? G_stk->get(2) : 0);
    G_stk->push(v2);
    G_stk->push(v1);

    /* note the starting index, if given */
    start_idx = 1;
    if (v3 != 0)
    {
        /* check the type */
        if (v3->typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the value */
        start_idx = (int)v3->val.intval;
    }

    /* 
     *   remember the last search string (the second argument), and reset any
     *   old group registers (since they'd point into the previous string) 
     */
    G_bif_tads_globals->last_rex_str->val = *v2;
    G_bif_tads_globals->rex_searcher->clear_group_regs();

    /* 
     *   check what we have for the pattern - we could have either a string
     *   giving the regular expression, or a RexPattern object with the
     *   compiled pattern 
     */
    if (G_stk->get(0)->typ == VM_OBJ
        && CVmObjPattern::is_pattern_obj(vmg_ G_stk->get(0)->val.obj))
    {
        vm_val_t pat_val;

        /* get the pattern object */
        G_stk->pop(&pat_val);
        pat_obj = (CVmObjPattern *)vm_objp(vmg_ pat_val.val.obj);
    }
    else
    {
        /* get the pattern string */
        pat_str = pop_str_val(vmg0_);
    }

    /* get the string to match */
    str = pop_str_val(vmg0_);
    len = vmb_get_len(str);
    p.set((char *)str + VMB_LEN);

    /* if the starting index is negative, it's from the end of the string */
    start_idx += (start_idx < 0 ? (int)p.len(len) : -1);

    /* skip to the starting index */
    for ( ; start_idx > 0 && len != 0 ; --start_idx, p.inc(&len)) ;

    /* match the pattern */
    if (pat_obj != 0)
    {
        /* match the compiled pattern object */
        match_len = G_bif_tads_globals->rex_searcher->
                    match_pattern(pat_obj->get_pattern(vmg0_),
                                  str + VMB_LEN, p.getptr(), len);
    }
    else
    {
        /* match the pattern to the regular expression string */
        match_len = G_bif_tads_globals->rex_searcher->
                    compile_and_match(pat_str + VMB_LEN, vmb_get_len(pat_str),
                                      str + VMB_LEN, p.getptr(), len);
    }

    /* check for a match */
    if (match_len >= 0)
    {
        /* we got a match - calculate the character length of the match */
        retval_int(vmg_ (long)p.len(match_len));
    }
    else
    {
        /* no match - return nil */
        retval_nil(vmg0_);
    }

    /* discard the arguments */
    G_stk->discard(argc);
}